

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O2

int __thiscall BPlusTree::GetHeight(BPlusTree *this)

{
  int iVar1;
  __shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_38 [8];
  shared_ptr<Node> traverseNode;
  
  if ((this->root).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    iVar1 = 0;
  }
  else {
    std::static_pointer_cast<Node,void>((shared_ptr<void> *)local_38);
    iVar1 = 0;
    while (local_38 != (undefined1  [8])0x0) {
      if (*(bool *)((long)local_38 + 0x30) != false) {
        iVar1 = iVar1 + 1;
        break;
      }
      std::static_pointer_cast<Node,void>((shared_ptr<void> *)&local_48);
      std::__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2> *)local_38,&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
      iVar1 = iVar1 + 1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&traverseNode);
  }
  return iVar1;
}

Assistant:

int BPlusTree::GetHeight() {
    int height = 0;
    if (root == nullptr) {
        return 0;
    } else {
        std::shared_ptr<Node> traverseNode = std::static_pointer_cast<Node>(root->ptrs[0]);
        while (traverseNode != nullptr) {
            height++;
            if (traverseNode->isLeaf) {
                break;
            } else {
                traverseNode = std::static_pointer_cast<Node>(traverseNode->ptrs[0]);
            }
        }
    }
    return height;
}